

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBaf.c
# Opt level: O2

void Io_WriteBaf(Abc_Ntk_t *pNtk,char *pFileName)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  char *pcVar9;
  void *pvVar10;
  ProgressBar *p;
  long *plVar11;
  char *pString;
  char *pString_00;
  int iVar12;
  int nItemsCur;
  size_t __size;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBaf.c"
                  ,0x5b,"void Io_WriteBaf(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    pcVar9 = pNtk->pName;
    pcVar7 = Extra_TimeStamp();
    fprintf(__stream,"# BAF (Binary Aig Format) for \"%s\" written by ABC on %s\n",pcVar9,pcVar7);
    fprintf(__stream,"%s%c",pNtk->pName,0);
    fprintf(__stream,"%d%c",(ulong)(uint)pNtk->vPis->nSize,0);
    fprintf(__stream,"%d%c",(ulong)(uint)pNtk->vPos->nSize,0);
    fprintf(__stream,"%d%c",(ulong)(uint)pNtk->nObjCounts[8],0);
    fprintf(__stream,"%d%c",(ulong)(uint)pNtk->nObjCounts[7],0);
    for (iVar12 = 0; iVar12 < pNtk->vPis->nSize; iVar12 = iVar12 + 1) {
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,iVar12);
      pcVar9 = Abc_ObjName(pAVar8);
      fprintf(__stream,"%s%c",pcVar9,0);
    }
    for (iVar12 = 0; iVar12 < pNtk->vPos->nSize; iVar12 = iVar12 + 1) {
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPos,iVar12);
      pcVar9 = Abc_ObjName(pAVar8);
      fprintf(__stream,"%s%c",pcVar9,0);
    }
    for (iVar12 = 0; iVar12 < pNtk->vBoxes->nSize; iVar12 = iVar12 + 1) {
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vBoxes,iVar12);
      if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 8) {
        pcVar9 = Abc_ObjName(pAVar8);
        fprintf(__stream,"%s%c",pcVar9,0);
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray]);
        fprintf(__stream,"%s%c",pcVar9,0);
        pcVar9 = Abc_ObjName((Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray]);
        fprintf(__stream,"%s%c",pcVar9);
      }
    }
    Abc_NtkCleanCopy(pNtk);
    uVar14 = 1;
    for (iVar12 = 0; iVar12 < pNtk->vCis->nSize; iVar12 = iVar12 + 1) {
      pvVar10 = Vec_PtrEntry(pNtk->vCis,iVar12);
      *(ulong *)((long)pvVar10 + 0x40) = uVar14;
      uVar14 = uVar14 + 1;
    }
    for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
      pAVar8 = Abc_NtkObj(pNtk,iVar12);
      if (pAVar8 != (Abc_Obj_t *)0x0) {
        iVar5 = Abc_AigNodeIsAnd(pAVar8);
        if (iVar5 != 0) {
          iVar5 = (int)uVar14;
          uVar14 = (ulong)(iVar5 + 1);
          pAVar8->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar5;
        }
      }
    }
    iVar12 = pNtk->nObjCounts[7];
    iVar5 = pNtk->vCos->nSize;
    lVar16 = (long)iVar5 + (long)iVar12 * 2;
    __size = lVar16 * 4;
    pvVar10 = malloc(__size);
    p = Extra_ProgressBarStart((FILE *)_stdout,(int)lVar16);
    nItemsCur = 0;
    for (iVar13 = 0; lVar16 = (long)nItemsCur, iVar13 < pNtk->vObjs->nSize; iVar13 = iVar13 + 1) {
      pAVar8 = Abc_NtkObj(pNtk,iVar13);
      if (pAVar8 != (Abc_Obj_t *)0x0) {
        iVar6 = Abc_AigNodeIsAnd(pAVar8);
        if (iVar6 != 0) {
          Extra_ProgressBarUpdate(p,nItemsCur,pString);
          ppvVar2 = pAVar8->pNtk->vObjs->pArray;
          piVar3 = (pAVar8->vFanins).pArray;
          uVar1 = *(uint *)&pAVar8->field_0x14;
          *(uint *)((long)pvVar10 + lVar16 * 4) =
               (uVar1 >> 10 & 1) + *(int *)((long)ppvVar2[*piVar3] + 0x40) * 2;
          nItemsCur = nItemsCur + 2;
          *(uint *)((long)pvVar10 + lVar16 * 4 + 4) =
               (uVar1 >> 0xb & 1) + *(int *)((long)ppvVar2[piVar3[1]] + 0x40) * 2;
        }
      }
    }
    lVar15 = 0;
    while( true ) {
      iVar13 = (int)lVar15;
      if (pNtk->vCos->nSize <= iVar13) break;
      plVar11 = (long *)Vec_PtrEntry(pNtk->vCos,iVar13);
      Extra_ProgressBarUpdate(p,iVar13 + nItemsCur,pString_00);
      lVar4 = *(long *)(*(long *)(*plVar11 + 0x20) + 8);
      iVar13 = (*(uint *)((long)plVar11 + 0x14) >> 10 & 1) +
               *(int *)(*(long *)(lVar4 + (long)*(int *)plVar11[4] * 8) + 0x40) * 2;
      *(int *)((long)pvVar10 + lVar15 * 4 + lVar16 * 4) = iVar13;
      if ((0 < *(int *)((long)plVar11 + 0x2c)) &&
         (lVar4 = *(long *)(lVar4 + (long)*(int *)plVar11[6] * 8),
         (*(uint *)(lVar4 + 0x14) & 0xf) == 8)) {
        *(uint *)((long)pvVar10 + lVar15 * 4 + lVar16 * 4) =
             (*(uint *)(lVar4 + 0x38) & 3) + iVar13 * 4;
      }
      lVar15 = lVar15 + 1;
    }
    Extra_ProgressBarStop(p);
    if ((iVar12 * 2 + iVar5) - nItemsCur == iVar13) {
      fwrite(pvVar10,1,__size,__stream);
      fclose(__stream);
      free(pvVar10);
      return;
    }
    __assert_fail("nBufferSize == nAnds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBaf.c"
                  ,0x9e,"void Io_WriteBaf(Abc_Ntk_t *, char *)");
  }
  fprintf(_stdout,"Io_WriteBaf(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/*
    Binary Aig Format

    The motivation for this format is to have
    - compact binary representation of large AIGs (~10x more compact than BLIF)
    - consequently, fast reading/writing of large AIGs (~10x faster than BLIF)
    - representation for all tech-ind info related to an AIG
    - human-readable file header

    The header:
    (1) May contain several lines of human-readable comments.
        Each comment line begins with symbol '#' and ends with symbol '\n'.
    (2) Always contains the following data. 
        - benchmark name
        - number of primary inputs
        - number of primary outputs
        - number of latches
        - number of AIG nodes (excluding the constant 1 node)
        Each entry is followed by 0-byte (character '\0'):
    (3) Next follow the names of the PIs, POs, and latches in this order. 
        Each name is followed by 0-byte (character '\0').
        Inside each set of names (PIs, POs, latches) there should be no
        identical names but the PO names may coincide with PI/latch names.

    The body:
    (1) First part of the body contains binary information about the internal AIG nodes.
        Each internal AIG node is represented using two edges (each edge is a 4-byte integer). 
        Each integer is the fanin ID followed by 1-bit representation of the complemented attribute.
        (For example, complemented edge to node 10 will be represented as 2*10 + 1 = 21.)
        The IDs of the nodes are created as follows: Constant 1 node has ID=0. 
        CIs (PIs and latch outputs) have 1-based IDs assigned in that order.
        Each node in the array of the internal AIG nodes has the ID assigned in that order.
        The constant 1 node is not written into the file.
    (2) Second part of the body contains binary information about the edges connecting 
        the COs (POs and latch inputs) to the internal AIG nodes.
        Each edge is a 4-byte integer the same way as a node fanin.
        The latch initial value (2 bits) is stored in this integer.
*/

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the AIG in the binary format.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Io_WriteBaf( Abc_Ntk_t * pNtk, char * pFileName )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Abc_Obj_t * pObj;
    int i, nNodes, nAnds, nBufferSize;
    unsigned * pBufferNode;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBaf(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // write the comment
    fprintf( pFile, "# BAF (Binary Aig Format) for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // write the network name
    fprintf( pFile, "%s%c", pNtk->pName, 0 );
    // write the number of PIs
    fprintf( pFile, "%d%c", Abc_NtkPiNum(pNtk), 0 );
    // write the number of POs
    fprintf( pFile, "%d%c", Abc_NtkPoNum(pNtk), 0 );
    // write the number of latches
    fprintf( pFile, "%d%c", Abc_NtkLatchNum(pNtk), 0 );
    // write the number of internal nodes
    fprintf( pFile, "%d%c", Abc_NtkNodeNum(pNtk), 0 );

    // write PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
    // write POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
    // write latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
        fprintf( pFile, "%s%c", Abc_ObjName(Abc_ObjFanin0(pObj)), 0 );
        fprintf( pFile, "%s%c", Abc_ObjName(Abc_ObjFanout0(pObj)), 0 );
    }

    // set the node numbers to be used in the output file
    Abc_NtkCleanCopy( pNtk );
    nNodes = 1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)nNodes++;
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)nNodes++;

    // write the nodes into the buffer
    nAnds = 0;
    nBufferSize = Abc_NtkNodeNum(pNtk) * 2 + Abc_NtkCoNum(pNtk);
    pBufferNode = ABC_ALLOC( unsigned, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, nBufferSize );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, nAnds, NULL );
        pBufferNode[nAnds++] = (((int)(ABC_PTRINT_T)Abc_ObjFanin0(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC0(pObj);
        pBufferNode[nAnds++] = (((int)(ABC_PTRINT_T)Abc_ObjFanin1(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC1(pObj);
    }

    // write the COs into the buffer
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, nAnds, NULL );
        pBufferNode[nAnds] = (((int)(ABC_PTRINT_T)Abc_ObjFanin0(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC0(pObj);
        if ( Abc_ObjFanoutNum(pObj) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
            pBufferNode[nAnds] = (pBufferNode[nAnds] << 2) | ((int)(ABC_PTRINT_T)Abc_ObjData(Abc_ObjFanout0(pObj)) & 3);
        nAnds++;
    }
    Extra_ProgressBarStop( pProgress );
    assert( nBufferSize == nAnds );

    // write the buffer
    fwrite( pBufferNode, 1, sizeof(int) * nBufferSize, pFile );
    fclose( pFile );
    ABC_FREE( pBufferNode );
}